

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Cancel_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Resupply_Cancel_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Resupply_Cancel_PDU *this)

{
  ostream *poVar1;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Resupply_Cancel_PDU *local_18;
  Resupply_Cancel_PDU *this_local;
  
  local_18 = this;
  this_local = (Resupply_Cancel_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Resupply Cancel-\n");
  Logistics_Header::GetAsString_abi_cxx11_(&local_210,&this->super_Logistics_Header);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  std::operator<<(poVar1,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Resupply_Cancel_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Resupply Cancel-\n"
       << IndentString( Logistics_Header::GetAsString(), 1 );

    return ss.str();
}